

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

bool glcts::verifyImage<unsigned_int,1u,3u,3u>(uint *data,uint *expected_values,GLuint n_layers)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  uVar1 = n_layers * 6;
  if (uVar1 == 0) {
    bVar10 = true;
  }
  else {
    iVar4 = 0;
    iVar5 = 0;
    bVar10 = false;
    uVar6 = 0;
    do {
      bVar9 = false;
      uVar3 = 0;
      iVar2 = iVar5;
      iVar7 = iVar4;
      do {
        lVar8 = 0;
        do {
          if (data[(uint)(iVar7 + (int)lVar8)] != expected_values[(uint)(iVar2 + (int)lVar8)]) {
            if (!bVar9) {
              return bVar10;
            }
            goto LAB_00d7bf58;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        bVar9 = 1 < uVar3;
        uVar3 = uVar3 + 1;
        iVar2 = iVar2 + 3;
        iVar7 = iVar7 + n_layers * 0x12;
      } while (uVar3 != 3);
LAB_00d7bf58:
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 9;
      iVar4 = iVar4 + 3;
      bVar10 = uVar1 <= uVar6;
    } while (uVar6 != uVar1);
  }
  return bVar10;
}

Assistant:

bool verifyImage(const T* data, const T* expected_values, const glw::GLuint n_layers)
{
	static const glw::GLuint n_faces = 6;

	const glw::GLuint n_total_faces = n_layers * n_faces;

	for (glw::GLuint face = 0; face < n_total_faces; ++face)
	{
		if (false == verifyFace<T, N_Components, Width, Height>(data, face, expected_values, n_total_faces * Width))
		{
			return false;
		}
	}

	return true;
}